

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O0

Duration absl::lts_20250127::operator-(Duration d)

{
  Duration DVar1;
  bool bVar2;
  uint32_t uVar3;
  int64_t iVar4;
  long lVar5;
  uint32_t in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  HiRep this;
  Duration d_00;
  Duration d_01;
  Duration d_02;
  Duration d_03;
  Duration DVar6;
  undefined8 local_140;
  undefined4 local_138;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined8 local_78;
  undefined4 local_70;
  Duration d_local;
  undefined4 local_c;
  
  DVar6.rep_hi_.lo_ = d.rep_lo_;
  this = d.rep_hi_;
  DVar6.rep_hi_.hi_ = 0;
  DVar6.rep_lo_ = in_EDX;
  uVar3 = time_internal::GetRepLo((time_internal *)this,DVar6);
  if (uVar3 == 0) {
    d_00.rep_hi_.hi_ = 0;
    d_00.rep_hi_.lo_ = DVar6.rep_hi_.lo_;
    d_00.rep_lo_ = (uint32_t)extraout_RDX;
    iVar4 = time_internal::GetRepHi((time_internal *)this,d_00);
    lVar5 = std::numeric_limits<long>::min();
    if (iVar4 == lVar5) {
      DVar6 = InfiniteDuration();
      local_78 = DVar6.rep_hi_;
      d_local.rep_hi_.hi_ = (uint32_t)local_78;
      d_local.rep_lo_ = local_78._4_4_;
      local_70 = DVar6.rep_lo_;
      local_c = local_70;
    }
    else {
      d_01.rep_hi_.hi_ = 0;
      d_01.rep_hi_.lo_ = DVar6.rep_hi_.lo_;
      d_01.rep_lo_ = (uint32_t)extraout_RDX_00;
      iVar4 = time_internal::GetRepHi((time_internal *)this,d_01);
      DVar6 = time_internal::MakeDuration(-iVar4,0);
      local_a8 = DVar6.rep_hi_;
      d_local.rep_hi_.hi_ = (uint32_t)local_a8;
      d_local.rep_lo_ = local_a8._4_4_;
      local_a0 = DVar6.rep_lo_;
      local_c = local_a0;
    }
  }
  else {
    bVar2 = time_internal::IsInfiniteDuration(d);
    if (bVar2) {
      DVar6 = time_internal::OppositeInfinity(d);
      local_f0 = DVar6.rep_hi_;
      d_local.rep_hi_.hi_ = (uint32_t)local_f0;
      d_local.rep_lo_ = local_f0._4_4_;
      local_e8 = DVar6.rep_lo_;
      local_c = local_e8;
    }
    else {
      d_02.rep_hi_.hi_ = 0;
      d_02.rep_hi_.lo_ = DVar6.rep_hi_.lo_;
      d_02.rep_lo_ = (uint32_t)extraout_RDX_01;
      iVar4 = time_internal::GetRepHi((time_internal *)this,d_02);
      iVar4 = time_internal::NegateAndSubtractOne(iVar4);
      d_03.rep_hi_.hi_ = 0;
      d_03.rep_hi_.lo_ = DVar6.rep_hi_.lo_;
      d_03.rep_lo_ = (uint32_t)extraout_RDX_02;
      uVar3 = time_internal::GetRepLo((time_internal *)this,d_03);
      DVar6 = time_internal::MakeDuration(iVar4,4000000000 - (ulong)uVar3);
      local_140 = DVar6.rep_hi_;
      d_local.rep_hi_.hi_ = (uint32_t)local_140;
      d_local.rep_lo_ = local_140._4_4_;
      local_138 = DVar6.rep_lo_;
      local_c = local_138;
    }
  }
  DVar1.rep_lo_ = local_c;
  DVar1.rep_hi_.lo_ = d_local.rep_hi_.hi_;
  DVar1.rep_hi_.hi_ = d_local.rep_lo_;
  return DVar1;
}

Assistant:

ABSL_ATTRIBUTE_CONST_FUNCTION constexpr Duration operator-(Duration d) {
  // This is a little interesting because of the special cases.
  //
  // If rep_lo_ is zero, we have it easy; it's safe to negate rep_hi_, we're
  // dealing with an integral number of seconds, and the only special case is
  // the maximum negative finite duration, which can't be negated.
  //
  // Infinities stay infinite, and just change direction.
  //
  // Finally we're in the case where rep_lo_ is non-zero, and we can borrow
  // a second's worth of ticks and avoid overflow (as negating int64_t-min + 1
  // is safe).
  return time_internal::GetRepLo(d) == 0
             ? time_internal::GetRepHi(d) ==
                       (std::numeric_limits<int64_t>::min)()
                   ? InfiniteDuration()
                   : time_internal::MakeDuration(-time_internal::GetRepHi(d))
             : time_internal::IsInfiniteDuration(d)
                   ? time_internal::OppositeInfinity(d)
                   : time_internal::MakeDuration(
                         time_internal::NegateAndSubtractOne(
                             time_internal::GetRepHi(d)),
                         time_internal::kTicksPerSecond -
                             time_internal::GetRepLo(d));
}